

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall
countConversions_mols_Test::~countConversions_mols_Test(countConversions_mols_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(countConversions, mols)
{
    using namespace units;
    EXPECT_NEAR(convert(mol, count), 6.02214076e23, test::precise_tolerance);
    EXPECT_NEAR(
        convert(mol.inv(), one), 1.0 / 6.02214076e23, test::precise_tolerance);
    EXPECT_NEAR(
        convert(count, mol), 1.0 / 6.02214076e23, test::precise_tolerance);
    EXPECT_NEAR(
        convert(one, mol.inv()), 6.02214076e23, test::precise_tolerance);
    // failed conversion
    EXPECT_TRUE(std::isnan(convert(mol.pow(2), count)));
    EXPECT_TRUE(std::isnan(convert(mol.pow(2), count.pow(2))));
}